

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MathLibrary.cpp
# Opt level: O1

double Js::Math::Pow(double x,double y)

{
  double dVar1;
  
  dVar1 = JavascriptNumber::DirectPow(x,y);
  return dVar1;
}

Assistant:

double Math::Pow( double x, double y )
    {
        double result = 0;

#if defined(_M_IX86) && defined(_WIN32) // TODO: xplat support
        // We can't just use "if (0 == y)" because NaN compares
        // equal to 0 according to our compilers.
        if( 0 == NumberUtilities::LuLoDbl( y ) && 0 == ( NumberUtilities::LuHiDbl( y ) & 0x7FFFFFFF ) )
        {
            // Result is 1 even if x is NaN.
            result = 1;
        }
        else if( 1.0 == Math::Abs( x ) && !NumberUtilities::IsFinite( y ) )
        {
            result = JavascriptNumber::NaN;
        }
        else
        {
            int32 intY;
            // range [-8, 8] is from JavascriptNumber::DirectPowDoubleInt
            if (JavascriptNumber::TryGetInt32Value(y, &intY) && intY >= -8 && intY <= 8)
            {
                result = JavascriptNumber::DirectPowDoubleInt(x, intY);
            }
            else if( AutoSystemInfo::Data.SSE2Available() )
            {
                _asm {
                    movsd xmm0, x
                    movsd xmm1, y
                    call dword ptr[__libm_sse2_pow]
                    movsd result, xmm0
                }
            }
            else
            {
                result = ::pow( x, y );
            }
        }
#else
        result = JavascriptNumber::DirectPow( x, y );
#endif
        return result;
    }